

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O0

void __thiscall tst_XmlModelSerialiser::validateXmlOutput(tst_XmlModelSerialiser *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  qsizetype *pqVar4;
  QXmlStreamReader local_60 [8];
  QXmlStreamReader xmlReader;
  undefined1 local_48 [8];
  XmlModelSerialiser serialiser;
  undefined1 local_30 [8];
  QByteArray modelData;
  QAbstractItemModel *sourceModel;
  tst_XmlModelSerialiser *this_local;
  
  iVar3 = qMetaTypeId<QAbstractItemModel_const*>();
  pqVar4 = (qsizetype *)QTest::qData("sourceModel",iVar3);
  modelData.d.size = *pqVar4;
  QByteArray::QByteArray((QByteArray *)local_30);
  XmlModelSerialiser::XmlModelSerialiser
            ((XmlModelSerialiser *)local_48,(QAbstractItemModel *)modelData.d.size,(QObject *)0x0);
  XmlModelSerialiser::saveModel((QByteArray *)local_48);
  QXmlStreamReader::QXmlStreamReader(local_60,(QByteArray *)local_30);
  while (bVar1 = QXmlStreamReader::atEnd(), ((bVar1 ^ 0xff) & 1) != 0) {
    QXmlStreamReader::readNext();
  }
  bVar2 = QXmlStreamReader::hasError(local_60);
  QTest::qVerify((bool)(~bVar2 & 1),"!xmlReader.hasError()","",
                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                 ,0x62);
  QXmlStreamReader::~QXmlStreamReader(local_60);
  XmlModelSerialiser::~XmlModelSerialiser((XmlModelSerialiser *)local_48);
  QByteArray::~QByteArray((QByteArray *)local_30);
  return;
}

Assistant:

void tst_XmlModelSerialiser::validateXmlOutput()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QByteArray modelData;
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.saveModel(&modelData);
    QXmlStreamReader xmlReader(modelData);
    while (!xmlReader.atEnd())
        xmlReader.readNext();
    QVERIFY(!xmlReader.hasError());
}